

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O0

double __thiscall APathFollower::Splerp(APathFollower *this,double p1,double p2,double p3,double p4)

{
  double dVar1;
  double res;
  double t;
  double p4_local;
  double p3_local;
  double p2_local;
  double p1_local;
  APathFollower *this_local;
  
  dVar1 = (double)this->Time * (double)this->Time;
  return ((((p2 * 3.0 - p3 * 3.0) + p4) - p1) * (double)this->Time * dVar1 +
         (((p1 * 2.0 - p2 * 5.0) + p3 * 4.0) - p4) * dVar1 +
         (p3 - p1) * (double)this->Time + p2 * 2.0) * 0.5;
}

Assistant:

double APathFollower::Splerp (double p1, double p2, double p3, double p4)
{
	double t = Time;
	double res = 2*p2;
	res += (p3 - p1) * Time;
	t *= Time;
	res += (2*p1 - 5*p2 + 4*p3 - p4) * t;
	t *= Time;
	res += (3*p2 - 3*p3 + p4 - p1) * t;
	return 0.5f * res;
}